

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numeric_stats.cpp
# Opt level: O3

void duckdb::NumericStats::Serialize(BaseStatistics *stats,Serializer *serializer)

{
  Serializer *in_R9;
  NumericValueUnion val;
  NumericValueUnion val_00;
  
  (*serializer->_vptr_Serializer[2])(serializer,200,"max");
  (*serializer->_vptr_Serializer[6])(serializer);
  val.value_.hugeint.upper._0_1_ = (stats->stats_union).numeric_data.has_min;
  val.value_.bigint = *(undefined8 *)((long)&stats->stats_union + 0x10);
  val.value_.hugeint.upper._1_7_ = 0;
  SerializeNumericStatsValue
            ((duckdb *)stats,*(LogicalType **)((long)&stats->stats_union + 8),val,
             SUB81(serializer,0),in_R9);
  (*serializer->_vptr_Serializer[7])(serializer);
  (*serializer->_vptr_Serializer[3])(serializer);
  (*serializer->_vptr_Serializer[2])(serializer,0xc9,"min");
  (*serializer->_vptr_Serializer[6])(serializer);
  val_00.value_.hugeint.upper._0_1_ = (stats->stats_union).numeric_data.has_max;
  val_00.value_.bigint = *(undefined8 *)((long)&stats->stats_union + 0x20);
  val_00.value_.hugeint.upper._1_7_ = 0;
  SerializeNumericStatsValue
            ((duckdb *)stats,*(LogicalType **)((long)&stats->stats_union + 0x18),val_00,
             SUB81(serializer,0),in_R9);
  (*serializer->_vptr_Serializer[7])(serializer);
  (*serializer->_vptr_Serializer[3])(serializer);
  return;
}

Assistant:

void NumericStats::Serialize(const BaseStatistics &stats, Serializer &serializer) {
	auto &numeric_stats = NumericStats::GetDataUnsafe(stats);
	serializer.WriteObject(200, "max", [&](Serializer &object) {
		SerializeNumericStatsValue(stats.GetType(), numeric_stats.min, numeric_stats.has_min, object);
	});
	serializer.WriteObject(201, "min", [&](Serializer &object) {
		SerializeNumericStatsValue(stats.GetType(), numeric_stats.max, numeric_stats.has_max, object);
	});
}